

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_function.hpp
# Opt level: O3

double __thiscall sisl::function::eval(function *this,double d0,...)

{
  char in_AL;
  uint uVar1;
  ulong uVar2;
  undefined8 *puVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  double *pdVar4;
  undefined8 in_RSI;
  ulong uVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar6;
  double extraout_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  double *local_f8;
  ulong local_f0;
  undefined8 local_e8;
  double *local_e0;
  double *local_d8;
  double local_c8 [4];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_c8[1] = (double)in_RSI;
  local_c8[2] = (double)in_RDX;
  local_c8[3] = (double)in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  uVar1 = (*this->_vptr_function[0xc])();
  if ((int)uVar1 < 0) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x130,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (uVar1 != 0) {
    uVar6 = (ulong)uVar1;
    local_f8 = (double *)malloc(uVar6 * 8);
    if ((uVar1 != 1) && (((ulong)local_f8 & 0xf) != 0)) {
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                    "void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (local_f8 == (double *)0x0) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = std::ios::widen;
      __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    *local_f8 = d0;
    local_d8 = local_c8;
    local_e0 = (double *)&stack0x00000008;
    local_e8 = 0x4000000008;
    local_f0 = uVar6;
    if (uVar1 != 1) {
      uVar2 = 1;
      do {
        uVar5 = (ulong)local_e8._4_4_;
        if (uVar5 < 0xa1) {
          local_e8 = CONCAT44(local_e8._4_4_ + 0x10,(undefined4)local_e8);
          pdVar4 = (double *)((long)local_d8 + uVar5);
        }
        else {
          pdVar4 = local_e0;
          local_e0 = local_e0 + 1;
        }
        if (uVar6 == uVar2) goto LAB_0010b377;
        local_f8[uVar2] = *pdVar4;
        uVar2 = uVar2 + 1;
      } while (uVar6 != uVar2);
    }
    (*this->_vptr_function[3])(this,&local_f8);
    free(local_f8);
    return extraout_XMM0_Qa;
  }
LAB_0010b377:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

virtual const double eval(double d0, ...) {
        	va_list args;  
        	int n = this->dim();
        	vector p(n);

        	p[0] = d0;
			va_start(args, d0);  
        	for(int i = 1; i < n; i++) {
        		p[i] = va_arg (args, double);
        	}
        	va_end (args);
        	return this->operator()(p);
        }